

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

void StopREST(void)

{
  long lVar1;
  long in_FS_OFFSET;
  bool in_stack_0000001f;
  anon_struct_16_2_bf24d843 *up;
  anon_struct_16_2_bf24d843 *__end1;
  anon_struct_16_2_bf24d843 *__begin1;
  anon_struct_16_2_bf24d843 (*__range1) [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  anon_struct_16_2_bf24d843 *local_40;
  anon_struct_16_2_bf24d843 *__a;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __a = uri_prefixes;
  for (local_40 = uri_prefixes;
      local_40 != (anon_struct_16_2_bf24d843 *)&StartREST(std::any_const&)::$_0::typeinfo;
      local_40 = local_40 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(allocator<char> *)__a);
    UnregisterHTTPHandler(in_stack_ffffffffffffffd8,in_stack_0000001f);
    std::__cxx11::string::~string(in_stack_ffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StopREST()
{
    for (const auto& up : uri_prefixes) {
        UnregisterHTTPHandler(up.prefix, false);
    }
}